

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix-top.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *in_RSI;
  int err;
  uv_udp_t socket;
  config cfg;
  helix_protocol_t proto;
  sockaddr_in addr;
  helix_session_t session;
  char **in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  config *in_stack_fffffffffffffee0;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  helix_session_t in_stack_ffffffffffffff20;
  helix_event_callback_t in_stack_ffffffffffffff28;
  helix_protocol_t in_stack_ffffffffffffff30;
  long local_58 [2];
  long local_48;
  long local_40;
  int local_38;
  helix_protocol_t local_30;
  undefined1 local_28 [16];
  helix_session_t local_18;
  undefined8 *local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  memset(local_58,0,0x28);
  program = __xpg_basename((char *)*local_10);
  parse_options(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
  if (local_58[0] == 0) {
    fprintf(_stderr,"error: symbol is not specified. Use the \'-s\' option to specify it.\n");
    exit(1);
  }
  if (local_48 == 0) {
    fprintf(_stderr,
            "error: multicast protocol is not specified. Use the \'-P\' option to specify it.\n");
    exit(1);
  }
  if (local_40 == 0) {
    fprintf(_stderr,
            "error: multicast address is not specified. Use the \'-a\' option to specify it.\n");
    exit(1);
  }
  if (local_38 == 0) {
    fprintf(_stderr,"error: multicast port is not specified. Use the \'-p\' option to specify it.\n"
           );
    exit(1);
  }
  local_30 = helix_protocol_lookup((char *)socket.send_queue_size);
  if (local_30 == (helix_protocol_t)0x0) {
    fprintf(_stderr,"error: protocol \'%s\' is not supported\n",local_48);
    exit(1);
  }
  local_18 = helix_session_create
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        in_stack_ffffffffffffff20);
  if (local_18 == (helix_session_t)0x0) {
    fprintf(_stderr,"error: unable to create new session\n");
    exit(1);
  }
  helix_session_subscribe
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&stack0xfffffffffffffed0);
  if (iVar1 != 0) {
    libuv_error((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  iVar1 = uv_ip4_addr("0.0.0.0",local_38,local_28);
  if (iVar1 != 0) {
    libuv_error((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  iVar1 = uv_udp_bind(&stack0xfffffffffffffed0,local_28,4);
  if (iVar1 != 0) {
    libuv_error((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  iVar1 = uv_udp_set_membership(&stack0xfffffffffffffed0,local_40,0,1);
  if (iVar1 != 0) {
    libuv_error((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  iVar1 = uv_udp_recv_start(&stack0xfffffffffffffed0,alloc_packet,recv_packet);
  if (iVar1 != 0) {
    libuv_error((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  initscr();
  wclear(_stdscr);
  wrefresh(_stdscr);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  endwin();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	helix_session_t session;
	struct sockaddr_in addr;
	helix_protocol_t proto;
	struct config cfg = {};
	uv_udp_t socket;
	int err;

	program = basename(argv[0]);

	parse_options(&cfg, argc, argv);

	if (!cfg.symbol) {
		fprintf(stderr, "error: symbol is not specified. Use the '-s' option to specify it.\n");
		exit(1);
	}

	if (!cfg.proto) {
		fprintf(stderr, "error: multicast protocol is not specified. Use the '-P' option to specify it.\n");
		exit(1);
	}

	if (!cfg.multicast_addr) {
		fprintf(stderr, "error: multicast address is not specified. Use the '-a' option to specify it.\n");
		exit(1);
	}

	if (!cfg.multicast_port) {
		fprintf(stderr, "error: multicast port is not specified. Use the '-p' option to specify it.\n");
		exit(1);
	}

	proto = helix_protocol_lookup(cfg.proto);
	if (!proto) {
		fprintf(stderr, "error: protocol '%s' is not supported\n", cfg.proto);
		exit(1);
	}

	session = helix_session_create(proto, process_event, NULL);
	if (!session) {
		fprintf(stderr, "error: unable to create new session\n");
		exit(1);
	}

	helix_session_subscribe(session, cfg.symbol, cfg.max_orders);

	err = uv_udp_init(uv_default_loop(), &socket);
	if (err) {
		libuv_error("uv_udp_init", err);
	}
	socket.data = session;

	err = uv_ip4_addr("0.0.0.0", cfg.multicast_port, &addr);
	if (err) {
		libuv_error("uv_ip4_addr", err);
	}

	err = uv_udp_bind(&socket, (const struct sockaddr *)&addr, UV_UDP_REUSEADDR);
	if (err) {
		libuv_error("uv_udp_bind", err);
	}

	err = uv_udp_set_membership(&socket, cfg.multicast_addr, NULL, UV_JOIN_GROUP);
	if (err) {
		libuv_error("uv_udp_set_membership", err);
	}

	err = uv_udp_recv_start(&socket, alloc_packet, recv_packet);
	if (err) {
		libuv_error("uv_udp_recv_start", err);
	}

	initscr();

	clear();

	refresh();

	uv_run(uv_default_loop(), UV_RUN_DEFAULT);

	endwin();

	return 0;
}